

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O2

TestStatus *
vkt::image::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  bool bVar1;
  Allocation *pAVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  Handle<(vk::HandleType)19> setLayout;
  int iVar4;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  Image *pIVar5;
  VkDeviceSize VVar6;
  Buffer *pBVar7;
  ulong uVar8;
  DescriptorSetLayoutBuilder *pDVar9;
  DescriptorPoolBuilder *pDVar10;
  ProgramBinary *pPVar11;
  DescriptorSetUpdateBuilder *pDVar12;
  MessageBuilder *this;
  NotSupportedError *this_00;
  int iVar13;
  int iVar14;
  int layerNdx;
  VkDeviceSize VVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  VkDeviceSize VVar19;
  deUint32 dVar20;
  int *value;
  int iVar21;
  ulong uVar22;
  int iVar23;
  undefined4 *__s;
  VkExtent3D extent;
  VkDescriptorSet descriptorSet_1;
  RefBase<vk::VkCommandBuffer_s_*> local_5b8;
  VkDescriptorPool local_590;
  IVec3 imageSize;
  IVec3 workSize;
  Location local_540;
  deUint32 local_534;
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> checksumImage;
  VkDescriptorImageInfo descriptorMultiImageInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  allDescriptorSets;
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> resultBuffer;
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> msImage;
  VkDescriptorSet descriptorSet;
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> constantsBuffer;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allMultisampledImageViews;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_468;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allChecksumImageViews;
  Location local_428;
  Location local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  deUint32 local_408;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  deUint32 local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  deUint32 local_3c8;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  deUint32 local_3a8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_398;
  VkPhysicalDeviceFeatures features;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_1f8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_1d8;
  undefined1 local_1b8 [8];
  SharedPtrStateBase *pSStack_1b0;
  undefined8 local_1a8;
  VkAllocationCallbacks *pVStack_1a0;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  local_534 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  (*vki->_vptr_InstanceInterface[2])(vki,physDevice,&features);
  if (features.shaderStorageImageMultisample == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Multisampled storage images are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
               ,0xb9);
  }
  else {
    iVar4 = (*vki->_vptr_InstanceInterface[4])
                      (vki,physDevice,(ulong)caseDef->format,1,0,8,0,(int)local_1b8);
    if (iVar4 == -0xb) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
                 ,0xc0);
    }
    else {
      if ((caseDef->numSamples & ~local_1a8._4_4_) == 0) {
        pIVar5 = (Image *)operator_new(0x30);
        makeImageCreateInfo((VkImageCreateInfo *)&features,&caseDef->texture,caseDef->format,8,0);
        Image::Image(pIVar5,vk,device,allocator,(VkImageCreateInfo *)&features,
                     (MemoryRequirement)0x0);
        msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
        ptr = pIVar5;
        pIVar5 = (Image *)operator_new(0x30);
        Texture::Texture((Texture *)local_1b8,&caseDef->texture,1);
        makeImageCreateInfo((VkImageCreateInfo *)&features,(Texture *)local_1b8,VK_FORMAT_R32_SINT,9
                            ,0);
        Image::Image(pIVar5,vk,device,allocator,(VkImageCreateInfo *)&features,
                     (MemoryRequirement)0x0);
        dVar20 = (caseDef->texture).m_numLayers;
        checksumImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
        m_data.ptr = pIVar5;
        VVar6 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
        pBVar7 = (Buffer *)operator_new(0x30);
        VVar15 = VVar6 * (long)(int)dVar20;
        makeBufferCreateInfo((VkBufferCreateInfo *)&features,VVar15,0x10);
        image::Buffer::Buffer
                  (pBVar7,vk,device,allocator,(VkBufferCreateInfo *)&features,(MemoryRequirement)0x1
                  );
        pAVar2 = (pBVar7->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        __s = (undefined4 *)pAVar2->m_hostPtr;
        uVar22 = 0;
        constantsBuffer.
        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
             pBVar7;
        memset(__s,0,VVar15);
        uVar8 = 0;
        if (0 < (int)dVar20) {
          uVar8 = (ulong)dVar20;
        }
        for (; uVar8 != uVar22; uVar22 = uVar22 + 1) {
          *__s = (int)uVar22;
          __s = (undefined4 *)((long)__s + VVar6);
        }
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,VVar15);
        Texture::size((Texture *)&features);
        VVar15 = getImageSizeBytes((IVec3 *)&features,VK_FORMAT_R32_SINT);
        pBVar7 = (Buffer *)operator_new(0x30);
        makeBufferCreateInfo((VkBufferCreateInfo *)&features,VVar15,2);
        image::Buffer::Buffer
                  (pBVar7,vk,device,allocator,(VkBufferCreateInfo *)&features,(MemoryRequirement)0x1
                  );
        pAVar2 = (pBVar7->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        resultBuffer.super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
        m_data.ptr = pBVar7;
        memset(pAVar2->m_hostPtr,0,VVar15);
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,VVar15);
        ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                  ((DescriptorSetLayoutBuilder *)&features);
        pDVar9 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                           ((DescriptorSetLayoutBuilder *)&features,
                            VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
        pDVar9 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                           (pDVar9,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
        pDVar9 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                           (pDVar9,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
        ::vk::DescriptorSetLayoutBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1b8,pDVar9,vk,device,0);
        local_398.m_data.deleter.m_device = (VkDevice)local_1a8;
        local_398.m_data.deleter.m_allocator = pVStack_1a0;
        local_398.m_data.object.m_internal = (deUint64)local_1b8;
        local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)pSStack_1b0;
        local_1b8 = (undefined1  [8])0x0;
        pSStack_1b0 = (SharedPtrStateBase *)0x0;
        local_1a8 = (pointer)0x0;
        pVStack_1a0 = (VkAllocationCallbacks *)0x0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1b8);
        ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
                  ((DescriptorSetLayoutBuilder *)&features);
        ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1b8);
        pDVar10 = ::vk::DescriptorPoolBuilder::addType
                            ((DescriptorPoolBuilder *)local_1b8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                             dVar20);
        pDVar10 = ::vk::DescriptorPoolBuilder::addType
                            (pDVar10,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,dVar20);
        pDVar10 = ::vk::DescriptorPoolBuilder::addType
                            (pDVar10,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,dVar20);
        ::vk::DescriptorPoolBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)21>_> *)&features,pDVar10,vk,device,1,dVar20);
        local_1d8.m_data.deleter.m_device = (VkDevice)features._16_8_;
        local_1d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1d8.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
        local_1d8.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
        local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&features);
        std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
        ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                       *)local_1b8);
        setLayout.m_internal = local_398.m_data.object.m_internal;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_590.m_internal = local_1d8.m_data.object.m_internal;
        bVar1 = caseDef->singleLayerBind;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ::clear(&allDescriptorSets);
        if (bVar1 == true) {
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
          ::resize(&allDescriptorSets,(long)(caseDef->texture).m_numLayers);
          lVar18 = 0;
          for (lVar16 = 0; lVar16 < (caseDef->texture).m_numLayers; lVar16 = lVar16 + 1) {
            makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&features,vk,device,local_590
                              ,(VkDescriptorSetLayout)setLayout.m_internal);
            makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
                      ((image *)local_1b8,(Move<vk::Handle<(vk::HandleType)22>_> *)&features);
            de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                      ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                       ((long)&(allDescriptorSets.
                                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar18),
                       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                       local_1b8);
            de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
                      ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                       local_1b8);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&features);
            lVar18 = lVar18 + 0x10;
          }
        }
        else {
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
          ::resize(&allDescriptorSets,1);
          makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&features,vk,device,local_590,
                            (VkDescriptorSetLayout)setLayout.m_internal);
          makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
                    ((image *)local_1b8,(Move<vk::Handle<(vk::HandleType)22>_> *)&features);
          de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                    (allDescriptorSets.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                     local_1b8);
          de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
                    ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                     local_1b8);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&features);
        }
        insertImageViews(vk,device,caseDef,caseDef->format,
                         (VkImage)((msImage.
                                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                    .m_data.ptr)->m_image).
                                  super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                  m_internal,&allMultisampledImageViews);
        insertImageViews(vk,device,caseDef,VK_FORMAT_R32_SINT,
                         (VkImage)((checksumImage.
                                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                    .m_data.ptr)->m_image).
                                  super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                  m_internal,&allChecksumImageViews);
        makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&features,vk,device,
                           (VkDescriptorSetLayout)local_398.m_data.object.m_internal);
        local_468.m_data.deleter.m_device = (VkDevice)features._16_8_;
        local_468.m_data.deleter.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_468.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
        local_468.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
        local_468.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&features);
        ::vk::createCommandPool
                  ((Move<vk::Handle<(vk::HandleType)24>_> *)&features,vk,device,2,local_534,
                   (VkAllocationCallbacks *)0x0);
        local_1f8.m_data.deleter.m_device = (VkDevice)features._16_8_;
        local_1f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1f8.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
        local_1f8.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
        local_1f8.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&features);
        ::vk::allocateCommandBuffer
                  ((Move<vk::VkCommandBuffer_s_*> *)&features,vk,device,
                   (VkCommandPool)local_1f8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY
                  );
        local_5b8.m_data.deleter.m_device = (VkDevice)features._16_8_;
        local_5b8.m_data.deleter.m_pool.m_internal._0_4_ = features.sampleRateShading;
        local_5b8.m_data.deleter.m_pool.m_internal._4_4_ = features.dualSrcBlend;
        local_5b8.m_data.object = (VkCommandBuffer_s *)features._0_8_;
        local_5b8.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                  ((RefBase<vk::VkCommandBuffer_s_*> *)&features);
        if (caseDef->singleLayerBind == true) {
          tcu::Vector<int,_3>::Vector(&workSize,(Vector<int,_3> *)caseDef);
        }
        else {
          Texture::size((Texture *)&workSize);
        }
        bVar1 = caseDef->singleLayerBind;
        uVar8 = 0;
        if (0 < (int)dVar20) {
          uVar8 = (ulong)dVar20;
        }
        dVar20 = (caseDef->texture).m_numLayers;
        pPVar3 = context->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageSize,"comp_store",(allocator<char> *)&descriptorMultiImageInfo);
        pPVar11 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&imageSize);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&features,vk,device,pPVar11,0);
        local_1a8 = (pointer)features._16_8_;
        pVStack_1a0 = (VkAllocationCallbacks *)features._24_8_;
        local_1b8._0_4_ = features.robustBufferAccess;
        local_1b8._4_4_ = features.fullDrawIndexUint32;
        pSStack_1b0 = (SharedPtrStateBase *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&features);
        std::__cxx11::string::~string((string *)&imageSize);
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&features,vk,device,
                            (VkPipelineLayout)local_468.m_data.object.m_internal,
                            (VkShaderModule)local_1b8);
        imageSize.m_data[0] = features.robustBufferAccess;
        imageSize.m_data[1] = features.fullDrawIndexUint32;
        stack0xfffffffffffffa80 = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&features);
        beginCommandBuffer(vk,local_5b8.m_data.object);
        (*vk->_vptr_DeviceInterface[0x4c])(vk,local_5b8.m_data.object,1);
        local_3b8 = 1;
        uStack_3b0 = 1;
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = dVar20;
        local_3a8 = dVar20;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((msImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange);
        local_3d8 = 1;
        uStack_3d0 = 1;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.baseArrayLayer = 0;
        subresourceRange_00.layerCount = dVar20;
        local_3c8 = dVar20;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features.multiViewport,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((checksumImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_00);
        (*vk->_vptr_DeviceInterface[0x6d])(vk,local_5b8.m_data.object,1,0x800,0,0,0,0,0,2,&features)
        ;
        if (bVar1 == false) {
          uVar8 = 1;
        }
        local_590.m_internal = uVar8 << 4;
        VVar19 = 0;
        for (lVar16 = 0; local_590.m_internal != lVar16; lVar16 = lVar16 + 0x10) {
          descriptorSet.m_internal =
               **(deUint64 **)
                 ((long)&(allDescriptorSets.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar16);
          descriptorMultiImageInfo.imageView.m_internal =
               **(deUint64 **)
                 ((long)&(allMultisampledImageViews.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar16);
          descriptorMultiImageInfo.sampler.m_internal = 0;
          descriptorMultiImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
          descriptorConstantsBufferInfo.buffer.m_internal =
               ((constantsBuffer.
                 super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                 m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal;
          descriptorConstantsBufferInfo.offset = VVar19;
          descriptorConstantsBufferInfo.range = VVar6;
          ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&features);
          descriptorSet_1.m_internal = 0;
          pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                              ((DescriptorSetUpdateBuilder *)&features,descriptorSet,
                               (Location *)&descriptorSet_1,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                               &descriptorConstantsBufferInfo);
          local_540.m_binding = 1;
          local_540.m_arrayElement = 0;
          pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                              (pDVar12,descriptorSet,&local_540,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                               &descriptorMultiImageInfo);
          ::vk::DescriptorSetUpdateBuilder::update(pDVar12,vk,device);
          ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&features);
          (*vk->_vptr_DeviceInterface[0x56])
                    (vk,local_5b8.m_data.object,1,local_468.m_data.object.m_internal,0,1,
                     (int)&descriptorSet,0,0);
          (*vk->_vptr_DeviceInterface[0x5d])
                    (vk,local_5b8.m_data.object,(ulong)(uint)workSize.m_data[0],
                     (ulong)(uint)workSize.m_data[1]);
          VVar19 = VVar19 + VVar6;
        }
        endCommandBuffer(vk,local_5b8.m_data.object);
        submitCommandsAndWait(vk,device,queue,local_5b8.m_data.object);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&imageSize);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_1b8);
        pPVar3 = context->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageSize,"comp_load",(allocator<char> *)&descriptorMultiImageInfo);
        pPVar11 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&imageSize);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&features,vk,device,pPVar11,0);
        local_1a8 = (pointer)features._16_8_;
        pVStack_1a0 = (VkAllocationCallbacks *)features._24_8_;
        local_1b8._0_4_ = features.robustBufferAccess;
        local_1b8._4_4_ = features.fullDrawIndexUint32;
        pSStack_1b0 = (SharedPtrStateBase *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&features);
        std::__cxx11::string::~string((string *)&imageSize);
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&features,vk,device,
                            (VkPipelineLayout)local_468.m_data.object.m_internal,
                            (VkShaderModule)local_1b8);
        imageSize.m_data[0] = features.robustBufferAccess;
        imageSize.m_data[1] = features.fullDrawIndexUint32;
        stack0xfffffffffffffa80 = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&features);
        beginCommandBuffer(vk,local_5b8.m_data.object);
        (*vk->_vptr_DeviceInterface[0x4c])(vk,local_5b8.m_data.object,1,imageSize.m_data._0_8_);
        local_3f8 = 1;
        uStack_3f0 = 1;
        subresourceRange_01.levelCount = 1;
        subresourceRange_01.aspectMask = 1;
        subresourceRange_01.baseMipLevel = 0;
        subresourceRange_01.baseArrayLayer = 0;
        subresourceRange_01.layerCount = dVar20;
        local_3e8 = dVar20;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0x40,0x20,VK_IMAGE_LAYOUT_GENERAL,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((msImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_01);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,local_5b8.m_data.object,0x800,0x800,0,0,0,0,0,1,&features);
        for (lVar16 = 0; local_590.m_internal != lVar16; lVar16 = lVar16 + 0x10) {
          descriptorSet_1.m_internal =
               **(deUint64 **)
                 ((long)&(allDescriptorSets.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar16);
          descriptorMultiImageInfo.imageView.m_internal =
               **(deUint64 **)
                 ((long)&(allMultisampledImageViews.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar16);
          descriptorMultiImageInfo.sampler.m_internal = 0;
          descriptorConstantsBufferInfo.offset =
               **(VkDeviceSize **)
                 ((long)&(allChecksumImageViews.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar16);
          descriptorConstantsBufferInfo.buffer.m_internal = 0;
          descriptorConstantsBufferInfo.range =
               CONCAT44(descriptorConstantsBufferInfo.range._4_4_,1);
          descriptorSet.m_internal =
               ((constantsBuffer.
                 super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                 m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal;
          descriptorMultiImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
          ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&features);
          local_540.m_binding = 0;
          local_540.m_arrayElement = 0;
          pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                              ((DescriptorSetUpdateBuilder *)&features,descriptorSet_1,&local_540,
                               VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                               (VkDescriptorBufferInfo *)&descriptorSet);
          local_420.m_binding = 1;
          local_420.m_arrayElement = 0;
          pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                              (pDVar12,descriptorSet_1,&local_420,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                               &descriptorMultiImageInfo);
          local_428.m_binding = 2;
          local_428.m_arrayElement = 0;
          pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                              (pDVar12,descriptorSet_1,&local_428,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                               (VkDescriptorImageInfo *)&descriptorConstantsBufferInfo);
          ::vk::DescriptorSetUpdateBuilder::update(pDVar12,vk,device);
          ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
                    ((DescriptorSetUpdateBuilder *)&features);
          (*vk->_vptr_DeviceInterface[0x56])
                    (vk,local_5b8.m_data.object,1,local_468.m_data.object.m_internal,0,1,
                     (int)&descriptorSet_1,0,0);
          (*vk->_vptr_DeviceInterface[0x5d])
                    (vk,local_5b8.m_data.object,(ulong)(uint)workSize.m_data[0],
                     (ulong)(uint)workSize.m_data[1],(ulong)(uint)workSize.m_data[2]);
        }
        endCommandBuffer(vk,local_5b8.m_data.object);
        submitCommandsAndWait(vk,device,queue,local_5b8.m_data.object);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&imageSize);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_1b8);
        beginCommandBuffer(vk,local_5b8.m_data.object);
        local_418 = 1;
        uStack_410 = 1;
        subresourceRange_02.levelCount = 1;
        subresourceRange_02.aspectMask = 1;
        subresourceRange_02.baseMipLevel = 0;
        subresourceRange_02.baseArrayLayer = 0;
        subresourceRange_02.layerCount = dVar20;
        local_408 = dVar20;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                   VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   (VkImage)((checksumImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_02);
        dVar20 = 0;
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,local_5b8.m_data.object,0x800,0x1000,0,0,0,0,0,1,&features);
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_1b8,(Vector<int,_3> *)caseDef);
        extent._0_8_ = (ulong)pSStack_1b0 & 0xffffffff;
        extent.depth = (caseDef->texture).m_numLayers;
        makeBufferImageCopy((VkBufferImageCopy *)&features,(image *)local_1b8,extent,dVar20);
        (*vk->_vptr_DeviceInterface[99])
                  (vk,local_5b8.m_data.object,
                   ((checksumImage.
                     super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                     m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                   object.m_internal,6,
                   ((resultBuffer.
                     super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                     m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,1,(int)&features);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&features,0x1000,0x2000,
                   (VkBuffer)
                   ((resultBuffer.
                     super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                     m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,0,VVar15);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,local_5b8.m_data.object,0x1000,0x4000,0,0,0,1,(int)&features,0,0);
        endCommandBuffer(vk,local_5b8.m_data.object);
        submitCommandsAndWait(vk,device,queue,local_5b8.m_data.object);
        pAVar2 = ((resultBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        ::vk::invalidateMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,VVar15);
        Texture::size((Texture *)&imageSize);
        value = (int *)pAVar2->m_hostPtr;
        iVar4 = (caseDef->texture).m_numSamples;
        iVar17 = 0;
        iVar13 = imageSize.m_data[0];
        if (imageSize.m_data[0] < 1) {
          iVar13 = 0;
        }
        iVar14 = imageSize.m_data[1];
        if (imageSize.m_data[1] < 1) {
          iVar14 = iVar17;
        }
        do {
          if (imageSize.m_data[2] <= iVar17) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&features,"OK",(allocator<char> *)local_1b8);
            tcu::TestStatus::pass(__return_storage_ptr__,(string *)&features);
LAB_006dfc6b:
            std::__cxx11::string::~string((string *)&features);
            ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_5b8);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_1f8);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_468);
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            ::~vector(&allChecksumImageViews);
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            ::~vector(&allMultisampledImageViews);
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
            ::~vector(&allDescriptorSets);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_1d8);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_398);
            de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            ~UniqueBase(&resultBuffer.
                         super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                       );
            de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            ~UniqueBase(&constantsBuffer.
                         super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                       );
            de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            ~UniqueBase(&checksumImage.
                         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                       );
            de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            ~UniqueBase(&msImage.
                         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                       );
            return __return_storage_ptr__;
          }
          for (iVar21 = 0; iVar21 != iVar14; iVar21 = iVar21 + 1) {
            for (iVar23 = 0; iVar13 != iVar23; iVar23 = iVar23 + 1) {
              if (*value != iVar4) {
                local_1b8 = (undefined1  [8])context->m_testCtx->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
                std::operator<<((ostream *)&pSStack_1b0,
                                "Some sample colors were incorrect at (x, y, layer) = (");
                std::ostream::operator<<((ostringstream *)&pSStack_1b0,iVar23);
                std::operator<<((ostream *)&pSStack_1b0,", ");
                std::ostream::operator<<((ostringstream *)&pSStack_1b0,iVar21);
                std::operator<<((ostream *)&pSStack_1b0,", ");
                std::ostream::operator<<((ostringstream *)&pSStack_1b0,iVar17);
                std::operator<<((ostream *)&pSStack_1b0,")");
                features._0_8_ =
                     tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b8,
                                (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream
                          ((ostringstream *)&features.imageCubeArray);
                std::operator<<((ostream *)&features.imageCubeArray,"Checksum value is ");
                this = tcu::MessageBuilder::operator<<((MessageBuilder *)&features,value);
                std::operator<<((ostream *)&this->m_str," but expected ");
                std::ostream::operator<<(&this->m_str,iVar4);
                tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream
                          ((ostringstream *)&features.imageCubeArray);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&features,"Some sample colors were incorrect",
                           (allocator<char> *)local_1b8);
                tcu::TestStatus::fail(__return_storage_ptr__,(string *)&features);
                goto LAB_006dfc6b;
              }
              value = value + 1;
            }
          }
          iVar17 = iVar17 + 1;
        } while( true );
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Requested sample count is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
                 ,0xc3);
    }
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				device				= context.getDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkRequirements(vki, physDevice, caseDef);

	// Images

	const UniquePtr<Image> msImage(new Image(
		vk, device, allocator, makeImageCreateInfo(caseDef.texture, caseDef.format, VK_IMAGE_USAGE_STORAGE_BIT, 0u), MemoryRequirement::Any));

	const UniquePtr<Image> checksumImage(new Image(
		vk, device, allocator,
		makeImageCreateInfo(Texture(caseDef.texture, 1), CHECKSUM_IMAGE_FORMAT, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 0u),
		MemoryRequirement::Any));

	// Buffer used to pass constants to the shader.

	const int			numLayers					= caseDef.texture.numLayers();
	const VkDeviceSize	bufferChunkSize				= getOptimalUniformBufferChunkSize(vki, physDevice, sizeof(deInt32));
	const VkDeviceSize	constantsBufferSizeBytes	= numLayers * bufferChunkSize;
	UniquePtr<Buffer>	constantsBuffer				(new Buffer(vk, device, allocator, makeBufferCreateInfo(constantsBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT),
													 MemoryRequirement::HostVisible));

	{
		const Allocation&	alloc	= constantsBuffer->getAllocation();
		deUint8* const		basePtr = static_cast<deUint8*>(alloc.getHostPtr());

		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(constantsBufferSizeBytes));

		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			deInt32* const valuePtr = reinterpret_cast<deInt32*>(basePtr + layerNdx * bufferChunkSize);
			*valuePtr = layerNdx;
		}

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), constantsBufferSizeBytes);
	}

	const VkDeviceSize	resultBufferSizeBytes	= getImageSizeBytes(caseDef.texture.size(), CHECKSUM_IMAGE_FORMAT);
	UniquePtr<Buffer>	resultBuffer			(new Buffer(vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT),
												 MemoryRequirement::HostVisible));

	{
		const Allocation& alloc = resultBuffer->getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Descriptors

	Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers));

	std::vector<SharedVkDescriptorSet>	allDescriptorSets;
	std::vector<SharedVkImageView>		allMultisampledImageViews;
	std::vector<SharedVkImageView>		allChecksumImageViews;

	insertDescriptorSets(vk, device, caseDef, *descriptorPool, *descriptorSetLayout, &allDescriptorSets);
	insertImageViews	(vk, device, caseDef, caseDef.format, **msImage, &allMultisampledImageViews);
	insertImageViews	(vk, device, caseDef, CHECKSUM_IMAGE_FORMAT, **checksumImage, &allChecksumImageViews);

	// Prepare commands

	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const tcu::IVec3				workSize				= (caseDef.singleLayerBind ? caseDef.texture.layerSize() : caseDef.texture.size());
	const int						loopNumLayers			= (caseDef.singleLayerBind ? numLayers : 1);
	const VkImageSubresourceRange	subresourceAllLayers	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, caseDef.texture.numLayers());

	// Pass 1: Write MS image
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_store"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **checksumImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Pass 2: "Resolve" MS image in compute shader
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_load"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo		descriptorChecksumImageInfo		= makeDescriptorImageInfo(DE_NULL, **allChecksumImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorChecksumImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Retrieve result
	{
		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **checksumImage, subresourceAllLayers),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(caseDef.texture.layerSize()), caseDef.texture.numLayers());
			vk.cmdCopyImageToBuffer(*cmdBuffer, **checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **resultBuffer, 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **resultBuffer, 0ull, resultBufferSizeBytes),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify
	{
		const Allocation& alloc = resultBuffer->getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);

		const IVec3		imageSize			= caseDef.texture.size();
		const deInt32*	pDataPtr			= static_cast<deInt32*>(alloc.getHostPtr());
		const deInt32	expectedChecksum	= caseDef.texture.numSamples();

		for (int layer = 0; layer < imageSize.z(); ++layer)
		for (int y = 0; y < imageSize.y(); ++y)
		for (int x = 0; x < imageSize.x(); ++x)
		{
			if (*pDataPtr != expectedChecksum)
			{
				context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Some sample colors were incorrect at (x, y, layer) = (" << x << ", " << y << ", " << layer << ")"	<< tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Checksum value is " << *pDataPtr << " but expected " << expectedChecksum << tcu::TestLog::EndMessage;

				return tcu::TestStatus::fail("Some sample colors were incorrect");
			}
			++pDataPtr;
		}

		return tcu::TestStatus::pass("OK");
	}
}